

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

string * cmsys::SystemTools::GetFilenameName(string *__return_storage_ptr__,string *filename)

{
  pointer pcVar1;
  long lVar2;
  
  lVar2 = std::__cxx11::string::rfind((char)filename,0x2f);
  if (lVar2 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::GetFilenameName(const std::string& filename)
{
#if defined(_WIN32)
  std::string::size_type slash_pos = filename.find_last_of("/\\");
#else
  std::string::size_type slash_pos = filename.rfind('/');
#endif
  if (slash_pos != std::string::npos) {
    return filename.substr(slash_pos + 1);
  } else {
    return filename;
  }
}